

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

sexp_conflict
make_opcode_procedure(sexp_conflict ctx,sexp_conflict op,sexp_uint_t i,sexp_sint_t flags)

{
  sexp_conflict psVar1;
  sexp key;
  uint uVar2;
  sexp psVar3;
  sexp cell;
  uint uVar4;
  char *message;
  long lVar5;
  sexp psVar6;
  bool bVar7;
  sexp_conflict ctx2;
  sexp_conflict refs;
  sexp_conflict params;
  sexp_conflict lambda;
  sexp_conflict local_e0;
  sexp_conflict ref;
  sexp_conflict bc;
  sexp_sint_t local_c8;
  sexp_uint_t local_c0;
  long local_b8;
  sexp local_b0;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t local_90;
  sexp_gc_var_t local_80;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_b8 = ((uint)flags & 1) + i;
  bc = (sexp_conflict)&DAT_0000043e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  params = (sexp_conflict)&DAT_0000043e;
  ref = (sexp_conflict)&DAT_0000043e;
  refs = (sexp_conflict)&DAT_0000043e;
  lambda = (sexp_conflict)&DAT_0000043e;
  ctx2 = (sexp_conflict)&DAT_0000043e;
  uVar4 = (uint)local_b8;
  uVar2 = (uint)(op->value).opcode.num_args;
  if (uVar4 == uVar2) {
    psVar1 = (op->value).type.getters;
    if (psVar1 != (sexp_conflict)0x0) {
      return psVar1;
    }
LAB_0011e9e7:
    __sexp_gc_preserver1.var = &bc;
    local_40.next = &__sexp_gc_preserver1;
    __sexp_gc_preserver1.next = (ctx->value).context.saves;
    local_40.var = &params;
    local_50.next = &local_40;
    local_50.var = &ref;
    local_60.next = &local_50;
    local_60.var = &refs;
    local_70.next = &local_60;
    local_70.var = &lambda;
    local_80.next = &local_70;
    local_80.var = &ctx2;
    local_90.next = &local_80;
    lVar5 = (long)(int)uVar4;
    local_90.var = &local_b0;
    (ctx->value).context.saves = &local_90;
    local_b0 = (sexp)&DAT_0000023e;
    psVar3 = (sexp)(lVar5 * 2 + 1);
    local_e0 = op;
    local_c8 = flags;
    local_c0 = i;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      local_b0 = sexp_cons_op(ctx,(sexp)0x0,2,psVar3,local_b0);
      psVar3 = (sexp)((long)&psVar3[-1].value + 0x60be);
    }
    (ctx->value).context.saves = local_90.next;
    params = local_b0;
    lambda = sexp_make_lambda(ctx,local_b0);
    ctx2 = sexp_make_child_context(ctx,lambda);
    psVar3 = sexp_extend_env(ctx2,(ctx->value).type.cpl,params,lambda);
    if ((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 0x13)) {
      (ctx2->value).type.cpl = psVar3;
      refs = (sexp_conflict)&DAT_0000023e;
      for (psVar6 = params; (psVar1 = ctx2, ((ulong)psVar6 & 3) == 0 && (psVar6->tag == 6));
          psVar6 = (psVar6->value).type.cpl) {
        key = (psVar6->value).type.name;
        cell = sexp_env_cell(ctx,psVar3,key,0);
        ref = sexp_make_ref(psVar1,key,cell);
        if ((((ulong)ref & 3) != 0) || (ref->tag != 0x13)) {
          sexp_push_op(ctx2,&refs,ref);
        }
      }
      if ((((ulong)refs & 3) != 0) || (refs->tag != 0x13)) {
        refs = sexp_reverse_op(ctx2,(sexp)0x0,1,refs);
      }
      psVar1 = local_e0;
      psVar3 = sexp_cons_op(ctx2,(sexp)0x0,2,local_e0,refs);
      if ((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 0x13)) {
        refs = psVar3;
        generate_opcode_app(ctx2,psVar3);
        bc = sexp_complete_bytecode(ctx2);
        (bc->value).flonum = (psVar1->value).flonum;
        psVar3 = sexp_make_procedure_op
                           (ctx2,(sexp)0x0,4,(sexp)(local_c8 * 2 + 1),(sexp)(local_c0 * 2 + 1),bc,
                            (sexp)&DAT_0000043e);
        if ((uint)local_b8 == (psVar1->value).opcode.num_args) {
          (psVar1->value).type.getters = psVar3;
        }
      }
    }
    (ctx->value).context.saves = __sexp_gc_preserver1.next;
    return psVar3;
  }
  if ((int)uVar4 < (int)uVar2) {
    message = "not enough args for opcode";
  }
  else {
    if (((op->value).opcode.flags & 1) != 0) goto LAB_0011e9e7;
    message = "too many args for opcode";
  }
  psVar3 = sexp_compile_error(ctx,message,op);
  return psVar3;
}

Assistant:

static sexp make_opcode_procedure (sexp ctx, sexp op, sexp_uint_t i, sexp_sint_t flags) {
  int j = i+(flags & SEXP_PROC_VARIADIC);
  sexp ls, res, env;
  sexp_gc_var6(bc, params, ref, refs, lambda, ctx2);
  if (j == sexp_opcode_num_args(op)) { /* return before preserving */
    if (sexp_opcode_proc(op)) return sexp_opcode_proc(op);
  } else if (j < sexp_opcode_num_args(op)) {
    return sexp_compile_error(ctx, "not enough args for opcode", op);
  } else if (! sexp_opcode_variadic_p(op)) { /* i > num_args */
    return sexp_compile_error(ctx, "too many args for opcode", op);
  }
  sexp_gc_preserve6(ctx, bc, params, ref, refs, lambda, ctx2);
  params = make_param_list(ctx, j);
  lambda = sexp_make_lambda(ctx, params);
  ctx2 = sexp_make_child_context(ctx, lambda);
  env = sexp_extend_env(ctx2, sexp_context_env(ctx), params, lambda);
  if (sexp_exceptionp(env)) {
    res = env;
  } else {
    sexp_context_env(ctx2) = env;
    for (ls=params, refs=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls)) {
      ref = sexp_make_ref(ctx2, sexp_car(ls), sexp_env_cell(ctx, env, sexp_car(ls), 0));
      if (!sexp_exceptionp(ref)) sexp_push(ctx2, refs, ref);
    }
    if (!sexp_exceptionp(refs))
      refs = sexp_reverse(ctx2, refs);
    refs = sexp_cons(ctx2, op, refs);
    if (sexp_exceptionp(refs)) {
      res = refs;
    } else {
      generate_opcode_app(ctx2, refs);
      bc = sexp_complete_bytecode(ctx2);
      sexp_bytecode_name(bc) = sexp_opcode_name(op);
      res=sexp_make_procedure(ctx2, sexp_make_fixnum(flags), sexp_make_fixnum(i), bc, SEXP_VOID);
      if (j == sexp_opcode_num_args(op))
        sexp_opcode_proc(op) = res;
    }
  }
  sexp_gc_release6(ctx);
  return res;
}